

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O0

void __thiscall wabt::anon_unknown_0::CWriter::WriteCSource(CWriter *this)

{
  Newline local_11;
  CWriter *local_10;
  CWriter *this_local;
  
  this->stream_ = this->c_stream_;
  local_10 = this;
  (anonymous_namespace)::CWriter::Write<char_const(&)[40],wabt::(anonymous_namespace)::Newline>
            ((CWriter *)this,(char (*) [40])"/* Automatically generated by wasm2c */",&local_11);
  WriteSourceTop(this);
  WriteFuncTypes(this);
  WriteTagTypes(this);
  WriteTags(this);
  WriteFuncDeclarations(this);
  WriteGlobalInitializers(this);
  WriteDataInitializers(this);
  WriteElemInitializers(this);
  WriteFuncs(this);
  WriteExports(this,Definitions);
  WriteInitInstanceImport(this);
  WriteImportProperties(this,Definitions);
  WriteInit(this);
  WriteFree(this);
  WriteGetFuncType(this);
  return;
}

Assistant:

void CWriter::WriteCSource() {
  stream_ = c_stream_;
  Write("/* Automatically generated by wasm2c */", Newline());
  WriteSourceTop();
  WriteFuncTypes();
  WriteTagTypes();
  WriteTags();
  WriteFuncDeclarations();
  WriteGlobalInitializers();
  WriteDataInitializers();
  WriteElemInitializers();
  WriteFuncs();
  WriteExports(CWriterPhase::Definitions);
  WriteInitInstanceImport();
  WriteImportProperties(CWriterPhase::Definitions);
  WriteInit();
  WriteFree();
  WriteGetFuncType();
}